

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * settype(parset s)

{
  char *pcStack_10;
  parset s_local;
  
  switch(s) {
  case QUIT:
    pcStack_10 = "END";
    break;
  case S:
    pcStack_10 = "stack";
    break;
  case S_H:
    pcStack_10 = "stack_enthalpies";
    break;
  case HP:
    pcStack_10 = "hairpin";
    break;
  case HP_H:
    pcStack_10 = "hairpin_enthalpies";
    break;
  case B:
    pcStack_10 = "bulge";
    break;
  case B_H:
    pcStack_10 = "bulge_enthalpies";
    break;
  case IL:
    pcStack_10 = "interior";
    break;
  case IL_H:
    pcStack_10 = "interior_enthalpies";
    break;
  case MMH:
    pcStack_10 = "mismatch_hairpin";
    break;
  case MMH_H:
    pcStack_10 = "mismatch_hairpin_enthalpies";
    break;
  case MMI:
    pcStack_10 = "mismatch_interior";
    break;
  case MMI_H:
    pcStack_10 = "mismatch_interior_enthalpies";
    break;
  case MMI1N:
    pcStack_10 = "mismatch_interior_1n";
    break;
  case MMI1N_H:
    pcStack_10 = "mismatch_interior_1n_enthalpies";
    break;
  case MMI23:
    pcStack_10 = "mismatch_interior_23";
    break;
  case MMI23_H:
    pcStack_10 = "mismatch_interior_23_enthalpies";
    break;
  case MMM:
    pcStack_10 = "mismatch_multi";
    break;
  case MMM_H:
    pcStack_10 = "mismatch_multi_enthalpies";
    break;
  case MME:
    pcStack_10 = "mismatch_exterior";
    break;
  case MME_H:
    pcStack_10 = "mismatch_exterior_enthalpies";
    break;
  case D5:
    pcStack_10 = "dangle5";
    break;
  case D5_H:
    pcStack_10 = "dangle5_enthalpies";
    break;
  case D3:
    pcStack_10 = "dangle3";
    break;
  case D3_H:
    pcStack_10 = "dangle3_enthalpies";
    break;
  case INT11:
    pcStack_10 = "int11";
    break;
  case INT11_H:
    pcStack_10 = "int11_enthalpies";
    break;
  case INT21:
    pcStack_10 = "int21";
    break;
  case INT21_H:
    pcStack_10 = "int21_enthalpies";
    break;
  case INT22:
    pcStack_10 = "int22";
    break;
  case INT22_H:
    pcStack_10 = "int22_enthalpies";
    break;
  case ML:
    pcStack_10 = "ML_params";
    break;
  case TL:
    pcStack_10 = "Tetraloops";
    break;
  case TRI:
    pcStack_10 = "Triloops";
    break;
  case HEX:
    pcStack_10 = "Hexaloops";
    break;
  case NIN:
    pcStack_10 = "NINIO";
    break;
  case MISC:
    pcStack_10 = "Misc";
    break;
  default:
    vrna_message_error("\nThe answer is: 42\n");
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

PUBLIC char *
settype(enum parset s)
{
  switch (s) {
    case        S:
      return "stack";
    case      S_H:
      return "stack_enthalpies";
    case       HP:
      return "hairpin";
    case     HP_H:
      return "hairpin_enthalpies";
    case        B:
      return "bulge";
    case      B_H:
      return "bulge_enthalpies";
    case       IL:
      return "interior";
    case     IL_H:
      return "interior_enthalpies";
    case      MME:
      return "mismatch_exterior";
    case    MME_H:
      return "mismatch_exterior_enthalpies";
    case      MMH:
      return "mismatch_hairpin";
    case    MMH_H:
      return "mismatch_hairpin_enthalpies";
    case      MMI:
      return "mismatch_interior";
    case    MMI_H:
      return "mismatch_interior_enthalpies";
    case    MMI1N:
      return "mismatch_interior_1n";
    case  MMI1N_H:
      return "mismatch_interior_1n_enthalpies";
    case    MMI23:
      return "mismatch_interior_23";
    case  MMI23_H:
      return "mismatch_interior_23_enthalpies";
    case      MMM:
      return "mismatch_multi";
    case    MMM_H:
      return "mismatch_multi_enthalpies";
    case       D5:
      return "dangle5";
    case     D5_H:
      return "dangle5_enthalpies";
    case       D3:
      return "dangle3";
    case     D3_H:
      return "dangle3_enthalpies";
    case    INT11:
      return "int11";
    case  INT11_H:
      return "int11_enthalpies";
    case    INT21:
      return "int21";
    case  INT21_H:
      return "int21_enthalpies";
    case    INT22:
      return "int22";
    case  INT22_H:
      return "int22_enthalpies";
    case       ML:
      return "ML_params";
    case      NIN:
      return "NINIO";
    case      TRI:
      return "Triloops";
    case       TL:
      return "Tetraloops";
    case      HEX:
      return "Hexaloops";
    case     QUIT:
      return "END";
    case     MISC:
      return "Misc";
    default:
      vrna_message_error("\nThe answer is: 42\n");
  }
  return "";
}